

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

bool __thiscall Args::Arg::isMisspelledName(Arg *this,String *name,StringList *possibleNames)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long *in_RDI;
  value_type *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [8];
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffff78;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_20 = in_RDX;
  (**(code **)(*in_RDI + 0x40))();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"--",&local_61);
    (**(code **)(*in_RDI + 0x40))();
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    bVar1 = details::isMisspelledName(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"--",&local_b9);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (**(code **)(*in_RDI + 0x40))();
      std::operator+(local_20,__rhs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__rhs,in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      return true;
    }
  }
  return false;
}

Assistant:

bool isMisspelledName(
		//! Name to check (misspelled).
		const String & name,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const override
	{
		if( !argumentName().empty() )
		{
			if( details::isMisspelledName( name,
				String( SL( "--" ) ) + argumentName() ) )
			{
				possibleNames.push_back( String( SL( "--" ) ) + argumentName() );

				return true;
			}
		}

		return false;
	}